

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::anon_unknown_3::PLYProperty::PLYProperty(PLYProperty *this,PLYProperty *p)

{
  ply_type t_size;
  ply_type type;
  PLYValueList *this_00;
  
  this->enc = p->enc;
  std::__cxx11::string::string((string *)&this->name,(string *)&p->name);
  t_size = p->tsize;
  this->tsize = t_size;
  type = p->tvalue;
  this->tvalue = type;
  if (t_size == ply_none) {
    this_00 = (PLYValueList *)createValue(type,this->enc);
  }
  else {
    this_00 = (PLYValueList *)operator_new(0x40);
    PLYValueList::PLYValueList(this_00,t_size,type,this->enc);
  }
  this->value = &this_00->super_PLYValue;
  this->receiver = (PLYReceiver *)0x0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const PLYProperty &p): enc(p.enc), name(p.name)
{
  tsize=p.tsize;
  tvalue=p.tvalue;

  if (tsize == ply_none)
  {
    value=createValue(tvalue, enc);
  }
  else
  {
    value=new PLYValueList(tsize, tvalue, enc);
  }

  receiver=0;
}